

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O0

uint32_t aom_rb_read_unsigned_literal(aom_read_bit_buffer *rb,int bits)

{
  int iVar1;
  int in_ESI;
  aom_read_bit_buffer *in_RDI;
  int bit;
  uint32_t value;
  undefined4 local_14;
  undefined4 local_10;
  
  local_10 = 0;
  for (local_14 = in_ESI + -1; -1 < local_14; local_14 = local_14 + -1) {
    iVar1 = aom_rb_read_bit(in_RDI);
    local_10 = iVar1 << ((byte)local_14 & 0x1f) | local_10;
  }
  return local_10;
}

Assistant:

uint32_t aom_rb_read_unsigned_literal(struct aom_read_bit_buffer *rb,
                                      int bits) {
  assert(bits <= 32);
  uint32_t value = 0;
  int bit;
  for (bit = bits - 1; bit >= 0; bit--)
    value |= (uint32_t)aom_rb_read_bit(rb) << bit;
  return value;
}